

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBody.cpp
# Opt level: O3

bool __thiscall OpenMD::RigidBody::getAtomPos(RigidBody *this,Vector3d *pos,uint index)

{
  double *pdVar1;
  uint i;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  Vector<double,_3U> result;
  Vector3d ref;
  double local_78 [4];
  double local_58 [4];
  Vector3d local_38;
  
  uVar5 = (ulong)index;
  uVar4 = (long)(this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3;
  if (uVar5 < uVar4) {
    StuntDouble::body2Lab
              (&local_38,&this->super_StuntDouble,
               (this->refCoords_).
               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar5);
    lVar3 = (long)(this->super_StuntDouble).localIndex_;
    lVar2 = *(long *)((long)&(((this->super_StuntDouble).snapshotMan_)->currentSnapshot_->atomData).
                             position.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start +
                     (this->super_StuntDouble).storage_);
    local_58[2] = (double)*(undefined8 *)(lVar2 + 0x10 + lVar3 * 0x18);
    pdVar1 = (double *)(lVar2 + lVar3 * 0x18);
    local_58[0] = *pdVar1;
    local_58[1] = pdVar1[1];
    local_78[0] = 0.0;
    local_78[1] = 0.0;
    local_78[2] = 0.0;
    lVar2 = 0;
    do {
      local_78[lVar2] = local_58[lVar2] + local_38.super_Vector<double,_3U>.data_[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    (pos->super_Vector<double,_3U>).data_[2] = local_78[2];
    (pos->super_Vector<double,_3U>).data_[0] = local_78[0];
    (pos->super_Vector<double,_3U>).data_[1] = local_78[1];
  }
  else {
    snprintf(painCave.errMsg,2000,
             "%d is an invalid index. The current rigid body contans %zu atoms.\n",(ulong)index,
             uVar4);
    painCave.isFatal = 0;
    simError();
  }
  return uVar5 < uVar4;
}

Assistant:

bool RigidBody::getAtomPos(Vector3d& pos, unsigned int index) {
    if (index < atoms_.size()) {
      Vector3d ref = body2Lab(refCoords_[index]);
      pos          = getPos() + ref;
      return true;
    } else {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "%d is an invalid index. The current rigid body contans %zu atoms.\n",
          index, atoms_.size());
      painCave.isFatal = 0;
      simError();
      return false;
    }
  }